

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction __thiscall
llvm::detail::IEEEFloat::multiplySignificand(IEEEFloat *this,IEEEFloat *rhs,IEEEFloat *addend)

{
  uint uVar1;
  Significand SVar2;
  fltSemantics *pfVar3;
  undefined8 uVar4;
  Significand *dst;
  integerPart lhs;
  bool bVar5;
  uint n;
  uint lhsParts;
  uint uVar6;
  opStatus oVar7;
  lostFraction moreSignificant;
  ulong uVar8;
  integerPart *rhs_00;
  lostFraction lf;
  uint significantParts;
  uint bits;
  IEEEFloat extendedAddend;
  uint extendedPrecision;
  opStatus status;
  fltSemantics extendedSemantics;
  fltSemantics *savedSemantics;
  Significand savedSignificand;
  bool ignored;
  Significand *pSStack_60;
  lostFraction lost_fraction;
  integerPart *fullSignificand;
  integerPart scratch [4];
  integerPart *lhsSignificand;
  uint precision;
  uint newPartsCount;
  uint partsCount;
  uint omsb;
  IEEEFloat *addend_local;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x3b9,
                  "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                 );
  }
  uVar1 = this->semantics->precision;
  n = partCountForBits(uVar1 * 2 + 1);
  if (n < 5) {
    pSStack_60 = (Significand *)&fullSignificand;
  }
  else {
    uVar8 = SUB168(ZEXT416(n) * ZEXT816(8),0);
    if (SUB168(ZEXT416(n) * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pSStack_60 = (Significand *)operator_new__(uVar8);
  }
  scratch[3] = (integerPart)significandParts(this);
  lhsParts = partCount(this);
  lhs = scratch[3];
  dst = pSStack_60;
  rhs_00 = significandParts(rhs);
  APInt::tcFullMultiply(&dst->part,(WordType *)lhs,rhs_00,lhsParts,lhsParts);
  savedSignificand.part._4_4_ = 0;
  uVar6 = APInt::tcMSB(&pSStack_60->part,n);
  newPartsCount = uVar6 + 1;
  this->exponent = this->exponent + rhs->exponent;
  this->exponent = this->exponent + 2;
  if ((addend != (IEEEFloat *)0x0) && (bVar5 = isNonZero(addend), bVar5)) {
    SVar2 = this->significand;
    extendedSemantics._4_8_ = this->semantics;
    uVar6 = uVar1 * 2;
    extendedAddend._20_4_ = uVar6 + 1;
    if (newPartsCount != uVar6) {
      if ((uint)extendedAddend._20_4_ <= newPartsCount) {
        __assert_fail("extendedPrecision > omsb",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x3e9,
                      "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                     );
      }
      APInt::tcShiftLeft(&pSStack_60->part,n,uVar6 - newPartsCount);
      this->exponent = this->exponent - ((extendedAddend._20_2_ + -1) - (short)newPartsCount);
    }
    pfVar3 = this->semantics;
    uVar4._0_2_ = pfVar3->maxExponent;
    uVar4._2_2_ = pfVar3->minExponent;
    uVar4._4_4_ = pfVar3->precision;
    extendedSemantics._0_4_ = pfVar3->sizeInBits;
    extendedPrecision = (uint)uVar4;
    status = extendedAddend._20_4_;
    if (n == 1) {
      (this->significand).part = *(integerPart *)pSStack_60;
    }
    else {
      (this->significand).parts = (integerPart *)pSStack_60;
    }
    this->semantics = (fltSemantics *)&extendedPrecision;
    IEEEFloat((IEEEFloat *)&significantParts,addend);
    oVar7 = convert((IEEEFloat *)&significantParts,(fltSemantics *)&extendedPrecision,rmTowardZero,
                    (bool *)((long)&savedSignificand + 3));
    if (oVar7 != opOK) {
      __assert_fail("status == opOK",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x3fb,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    savedSignificand.part._4_4_ = shiftSignificandRight((IEEEFloat *)&significantParts,1);
    if (savedSignificand.part._4_4_ != lfExactlyZero) {
      __assert_fail("lost_fraction == lfExactlyZero && \"Lost precision while shifting addend for fused-multiply-add.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x403,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    savedSignificand.part._4_4_ =
         addOrSubtractSignificand(this,(IEEEFloat *)&significantParts,false);
    if (n == 1) {
      *pSStack_60 = this->significand;
    }
    this->significand = SVar2;
    this->semantics = (fltSemantics *)extendedSemantics._4_8_;
    uVar6 = APInt::tcMSB(&pSStack_60->part,n);
    newPartsCount = uVar6 + 1;
    ~IEEEFloat((IEEEFloat *)&significantParts);
  }
  this->exponent = this->exponent - ((short)uVar1 + 1);
  if (uVar1 < newPartsCount) {
    uVar6 = partCountForBits(newPartsCount);
    moreSignificant = shiftRight(&pSStack_60->part,uVar6,newPartsCount - uVar1);
    savedSignificand.part._4_4_ = combineLostFractions(moreSignificant,savedSignificand.part._4_4_);
    this->exponent = this->exponent + (short)(newPartsCount - uVar1);
  }
  APInt::tcAssign((WordType *)scratch[3],&pSStack_60->part,lhsParts);
  if ((4 < n) && (pSStack_60 != (Significand *)0x0)) {
    operator_delete__(pSStack_60);
  }
  return savedSignificand.part._4_4_;
}

Assistant:

lostFraction IEEEFloat::multiplySignificand(const IEEEFloat &rhs,
                                            const IEEEFloat *addend) {
  unsigned int omsb;        // One, not zero, based MSB.
  unsigned int partsCount, newPartsCount, precision;
  integerPart *lhsSignificand;
  integerPart scratch[4];
  integerPart *fullSignificand;
  lostFraction lost_fraction;
  bool ignored;

  assert(semantics == rhs.semantics);

  precision = semantics->precision;

  // Allocate space for twice as many bits as the original significand, plus one
  // extra bit for the addition to overflow into.
  newPartsCount = partCountForBits(precision * 2 + 1);

  if (newPartsCount > 4)
    fullSignificand = new integerPart[newPartsCount];
  else
    fullSignificand = scratch;

  lhsSignificand = significandParts();
  partsCount = partCount();

  APInt::tcFullMultiply(fullSignificand, lhsSignificand,
                        rhs.significandParts(), partsCount, partsCount);

  lost_fraction = lfExactlyZero;
  omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  exponent += rhs.exponent;

  // Assume the operands involved in the multiplication are single-precision
  // FP, and the two multiplicants are:
  //   *this = a23 . a22 ... a0 * 2^e1
  //     rhs = b23 . b22 ... b0 * 2^e2
  // the result of multiplication is:
  //   *this = c48 c47 c46 . c45 ... c0 * 2^(e1+e2)
  // Note that there are three significant bits at the left-hand side of the
  // radix point: two for the multiplication, and an overflow bit for the
  // addition (that will always be zero at this point). Move the radix point
  // toward left by two bits, and adjust exponent accordingly.
  exponent += 2;

  if (addend && addend->isNonZero()) {
    // The intermediate result of the multiplication has "2 * precision"
    // signicant bit; adjust the addend to be consistent with mul result.
    //
    Significand savedSignificand = significand;
    const fltSemantics *savedSemantics = semantics;
    fltSemantics extendedSemantics;
    opStatus status;
    unsigned int extendedPrecision;

    // Normalize our MSB to one below the top bit to allow for overflow.
    extendedPrecision = 2 * precision + 1;
    if (omsb != extendedPrecision - 1) {
      assert(extendedPrecision > omsb);
      APInt::tcShiftLeft(fullSignificand, newPartsCount,
                         (extendedPrecision - 1) - omsb);
      exponent -= (extendedPrecision - 1) - omsb;
    }

    /* Create new semantics.  */
    extendedSemantics = *semantics;
    extendedSemantics.precision = extendedPrecision;

    if (newPartsCount == 1)
      significand.part = fullSignificand[0];
    else
      significand.parts = fullSignificand;
    semantics = &extendedSemantics;

    IEEEFloat extendedAddend(*addend);
    status = extendedAddend.convert(extendedSemantics, rmTowardZero, &ignored);
    assert(status == opOK);
    (void)status;

    // Shift the significand of the addend right by one bit. This guarantees
    // that the high bit of the significand is zero (same as fullSignificand),
    // so the addition will overflow (if it does overflow at all) into the top bit.
    lost_fraction = extendedAddend.shiftSignificandRight(1);
    assert(lost_fraction == lfExactlyZero &&
           "Lost precision while shifting addend for fused-multiply-add.");
    (void)lost_fraction;

    lost_fraction = addOrSubtractSignificand(extendedAddend, false);

    /* Restore our state.  */
    if (newPartsCount == 1)
      fullSignificand[0] = significand.part;
    significand = savedSignificand;
    semantics = savedSemantics;

    omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  }

  // Convert the result having "2 * precision" significant-bits back to the one
  // having "precision" significant-bits. First, move the radix point from
  // poision "2*precision - 1" to "precision - 1". The exponent need to be
  // adjusted by "2*precision - 1" - "precision - 1" = "precision".
  exponent -= precision + 1;

  // In case MSB resides at the left-hand side of radix point, shift the
  // mantissa right by some amount to make sure the MSB reside right before
  // the radix point (i.e. "MSB . rest-significant-bits").
  //
  // Note that the result is not normalized when "omsb < precision". So, the
  // caller needs to call IEEEFloat::normalize() if normalized value is
  // expected.
  if (omsb > precision) {
    unsigned int bits, significantParts;
    lostFraction lf;

    bits = omsb - precision;
    significantParts = partCountForBits(omsb);
    lf = shiftRight(fullSignificand, significantParts, bits);
    lost_fraction = combineLostFractions(lf, lost_fraction);
    exponent += bits;
  }

  APInt::tcAssign(lhsSignificand, fullSignificand, partsCount);

  if (newPartsCount > 4)
    delete [] fullSignificand;

  return lost_fraction;
}